

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O2

void __thiscall cfd::CoinSelectionOption::InitializeTxSizeInfo(CoinSelectionOption *this)

{
  uint32_t uVar1;
  TxOut txout;
  TxOutReference txout_ref;
  Script local_78;
  Script wpkh_script;
  
  std::__cxx11::string::string
            ((string *)&txout,"0014ffffffffffffffffffffffffffffffffffffffff",(allocator *)&txout_ref
            );
  cfd::core::Script::Script(&wpkh_script,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  cfd::core::Amount::Amount((Amount *)&txout_ref);
  cfd::core::TxOut::TxOut(&txout,(Amount *)&txout_ref,&wpkh_script);
  cfd::core::TxOutReference::TxOutReference(&txout_ref,&txout);
  uVar1 = cfd::core::AbstractTxOutReference::GetSerializeVsize();
  this->change_output_size_ = uVar1;
  cfd::core::Script::Script(&local_78);
  uVar1 = cfd::core::TxIn::EstimateTxInVsize(kP2wpkhAddress,(Script)txout._0_56_,&local_78);
  this->change_spend_size_ = uVar1;
  core::Script::~Script(&local_78);
  core::AbstractTxOutReference::~AbstractTxOutReference((AbstractTxOutReference *)&txout_ref);
  core::AbstractTxOut::~AbstractTxOut(&txout.super_AbstractTxOut);
  core::Script::~Script(&wpkh_script);
  return;
}

Assistant:

void CoinSelectionOption::InitializeTxSizeInfo() {
  // wpkh想定
  Script wpkh_script("0014ffffffffffffffffffffffffffffffffffffffff");
  TxOut txout(Amount(), wpkh_script);
  TxOutReference txout_ref(txout);
  change_output_size_ = txout_ref.GetSerializeVsize();
  change_spend_size_ =
      TxIn::EstimateTxInVsize(AddressType::kP2wpkhAddress, Script());
}